

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_set.h
# Opt level: O0

void __thiscall merlin::variable_set::~variable_set(variable_set *this)

{
  variable_set *this_local;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->m_dlocal);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->m_v);
  return;
}

Assistant:

~variable_set(void) {
	}